

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

SP __thiscall pbrt::BinaryReader::createEntity(BinaryReader *this,int typeTag)

{
  ostream *poVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SP SVar3;
  vec2i local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  undefined8 local_18;
  
  switch(in_EDX) {
  case 1:
    std::make_shared<pbrt::Scene>();
    break;
  case 2:
    std::make_shared<pbrt::Object>();
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"unknown entity type tag ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
    poVar1 = std::operator<<(poVar1," in binary file");
    std::endl<char,std::char_traits<char>>(poVar1);
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
    goto LAB_00116e63;
  case 4:
    std::make_shared<pbrt::Instance>();
    break;
  case 5:
    std::make_shared<pbrt::Camera>();
    break;
  case 6:
    local_18 = 0;
    std::make_shared<pbrt::Film,pbrt::math::vec2i>(&local_28);
    break;
  case 7:
    std::make_shared<pbrt::Spectrum>();
    break;
  case 8:
    std::make_shared<pbrt::Sampler>();
    break;
  case 9:
    std::make_shared<pbrt::Integrator>();
    break;
  case 10:
    std::make_shared<pbrt::Material>();
    break;
  case 0xb:
    std::make_shared<pbrt::DisneyMaterial>();
    break;
  case 0xc:
    std::make_shared<pbrt::UberMaterial>();
    break;
  case 0xd:
    std::make_shared<pbrt::MixMaterial>();
    break;
  case 0xe:
    std::make_shared<pbrt::GlassMaterial>();
    break;
  case 0xf:
    std::make_shared<pbrt::MirrorMaterial>();
    break;
  case 0x10:
    std::make_shared<pbrt::MatteMaterial>();
    break;
  case 0x11:
    std::make_shared<pbrt::SubstrateMaterial>();
    break;
  case 0x12:
    std::make_shared<pbrt::SubSurfaceMaterial>();
    break;
  case 0x13:
    std::make_shared<pbrt::FourierMaterial>();
    break;
  case 0x14:
    std::make_shared<pbrt::MetalMaterial>();
    break;
  case 0x15:
    std::make_shared<pbrt::PlasticMaterial>();
    break;
  case 0x16:
    std::make_shared<pbrt::TranslucentMaterial>();
    break;
  case 0x17:
    std::make_shared<pbrt::HairMaterial>();
    break;
  case 0x1e:
    std::make_shared<pbrt::Texture>();
    break;
  case 0x1f:
    std::make_shared<pbrt::ImageTexture>();
    break;
  case 0x20:
    std::make_shared<pbrt::ScaleTexture>();
    break;
  case 0x21:
    std::make_shared<pbrt::PtexFileTexture>();
    break;
  case 0x22:
    std::make_shared<pbrt::ConstantTexture>();
    break;
  case 0x23:
    std::make_shared<pbrt::CheckerTexture>();
    break;
  case 0x24:
    std::make_shared<pbrt::WindyTexture>();
    break;
  case 0x25:
    std::make_shared<pbrt::FbmTexture>();
    break;
  case 0x26:
    std::make_shared<pbrt::MarbleTexture>();
    break;
  case 0x27:
    std::make_shared<pbrt::MixTexture>();
    break;
  case 0x28:
    std::make_shared<pbrt::WrinkledTexture>();
    break;
  case 0x32:
    std::make_shared<pbrt::TriangleMesh>();
    break;
  case 0x33:
    std::make_shared<pbrt::QuadMesh>();
    break;
  case 0x34:
    std::make_shared<pbrt::Sphere>();
    break;
  case 0x35:
    std::make_shared<pbrt::Disk>();
    break;
  case 0x36:
    std::make_shared<pbrt::Curve>();
    break;
  case 0x3c:
    std::make_shared<pbrt::DiffuseAreaLightBB>();
    break;
  case 0x3d:
    std::make_shared<pbrt::DiffuseAreaLightRGB>();
    break;
  case 0x46:
    std::make_shared<pbrt::InfiniteLightSource>();
    break;
  case 0x47:
    std::make_shared<pbrt::DistantLightSource>();
    break;
  case 0x48:
    std::make_shared<pbrt::SpotLightSource>();
    break;
  case 0x49:
    std::make_shared<pbrt::PointLightSource>();
    break;
  case 0x50:
    std::make_shared<pbrt::PixelFilter>();
  }
  _Var2._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_28;
  (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)_Var2._M_pi;
  local_28.x = 0;
  local_28.y = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  _Var2._M_pi = extraout_RDX_00;
LAB_00116e63:
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Entity::SP createEntity(int typeTag)
    {
      switch (typeTag) {
      case TYPE_SCENE:
        return std::make_shared<Scene>();
      case TYPE_TEXTURE:
        return std::make_shared<Texture>();
      case TYPE_IMAGE_TEXTURE:
        return std::make_shared<ImageTexture>();
      case TYPE_SCALE_TEXTURE:
        return std::make_shared<ScaleTexture>();
      case TYPE_PTEX_FILE_TEXTURE:
        return std::make_shared<PtexFileTexture>();
      case TYPE_CONSTANT_TEXTURE:
        return std::make_shared<ConstantTexture>();
      case TYPE_CHECKER_TEXTURE:
        return std::make_shared<CheckerTexture>();
      case TYPE_WINDY_TEXTURE:
        return std::make_shared<WindyTexture>();
      case TYPE_FBM_TEXTURE:
        return std::make_shared<FbmTexture>();
      case TYPE_MARBLE_TEXTURE:
        return std::make_shared<MarbleTexture>();
      case TYPE_MIX_TEXTURE:
        return std::make_shared<MixTexture>();
      case TYPE_WRINKLED_TEXTURE:
        return std::make_shared<WrinkledTexture>();
      case TYPE_MATERIAL:
        return std::make_shared<Material>();
      case TYPE_DISNEY_MATERIAL:
        return std::make_shared<DisneyMaterial>();
      case TYPE_UBER_MATERIAL:
        return std::make_shared<UberMaterial>();
      case TYPE_MIX_MATERIAL:
        return std::make_shared<MixMaterial>();
      case TYPE_TRANSLUCENT_MATERIAL:
        return std::make_shared<TranslucentMaterial>();
      case TYPE_GLASS_MATERIAL:
        return std::make_shared<GlassMaterial>();
      case TYPE_PLASTIC_MATERIAL:
        return std::make_shared<PlasticMaterial>();
      case TYPE_MIRROR_MATERIAL:
        return std::make_shared<MirrorMaterial>();
      case TYPE_SUBSTRATE_MATERIAL:
        return std::make_shared<SubstrateMaterial>();
      case TYPE_SUBSURFACE_MATERIAL:
        return std::make_shared<SubSurfaceMaterial>();
      case TYPE_MATTE_MATERIAL:
        return std::make_shared<MatteMaterial>();
      case TYPE_FOURIER_MATERIAL:
        return std::make_shared<FourierMaterial>();
      case TYPE_METAL_MATERIAL:
        return std::make_shared<MetalMaterial>();
      case TYPE_HAIR_MATERIAL:
        return std::make_shared<HairMaterial>();
      case TYPE_FILM:
        return std::make_shared<Film>(vec2i(0));
      case TYPE_CAMERA:
        return std::make_shared<Camera>();
      case TYPE_TRIANGLE_MESH:
        return std::make_shared<TriangleMesh>();
      case TYPE_QUAD_MESH:
        return std::make_shared<QuadMesh>();
      case TYPE_SPHERE:
        return std::make_shared<Sphere>();
      case TYPE_DISK:
        return std::make_shared<Disk>();
      case TYPE_CURVE:
        return std::make_shared<Curve>();
      case TYPE_INSTANCE:
        return std::make_shared<Instance>();
      case TYPE_OBJECT:
        return std::make_shared<Object>();
      case TYPE_DIFFUSE_AREALIGHT_BB:
        return std::make_shared<DiffuseAreaLightBB>();
      case TYPE_DIFFUSE_AREALIGHT_RGB:
        return std::make_shared<DiffuseAreaLightRGB>();
      case TYPE_INFINITE_LIGHT_SOURCE:
        return std::make_shared<InfiniteLightSource>();
      case TYPE_DISTANT_LIGHT_SOURCE:
        return std::make_shared<DistantLightSource>();
      case TYPE_SPOT_LIGHT_SOURCE:
        return std::make_shared<SpotLightSource>();
      case TYPE_POINT_LIGHT_SOURCE:
        return std::make_shared<PointLightSource>();
      case TYPE_SPECTRUM:
        return std::make_shared<Spectrum>();
      case TYPE_SAMPLER:
        return std::make_shared<Sampler>();
      case TYPE_INTEGRATOR:
        return std::make_shared<Integrator>();
      case TYPE_PIXEL_FILTER:
        return std::make_shared<PixelFilter>();
      default:
        std::cerr << "unknown entity type tag " << typeTag << " in binary file" << std::endl;
        return Entity::SP();
      };
    }